

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

size_t rtosc_print_message(char *address,rtosc_arg_val_t *args,size_t n,char *buffer,size_t bs,
                          rtosc_print_options *opt,int cols_used)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  
  iVar1 = asnprintf(buffer,bs,"%s ",address);
  lVar3 = (long)iVar1;
  sVar2 = rtosc_print_arg_vals(args,n,buffer + lVar3,bs - lVar3,opt,cols_used + iVar1);
  return sVar2 + lVar3;
}

Assistant:

size_t rtosc_print_message(const char* address,
                           const rtosc_arg_val_t *args, size_t n,
                           char *buffer, size_t bs,
                           const rtosc_print_options* opt,
                           int cols_used)
{
    size_t wrt = asnprintf(buffer, bs, "%s ", address);
    cols_used += wrt;
    buffer += wrt;
    bs -= wrt;
    wrt += rtosc_print_arg_vals(args, n, buffer, bs, opt, cols_used);
    return wrt;
}